

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O1

bool slang::ast::checkAssertionArg
               (PropertyExprSyntax *propExpr,AssertionPortSymbol *formal,ASTContext *context,
               ActualArg *result,bool isRecursiveProp)

{
  Type *pTVar1;
  Scope *pSVar2;
  variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>
  *this;
  bool bVar3;
  int iVar4;
  ParenthesizedExpressionSyntax *pPVar5;
  Type *this_00;
  Expression *pEVar6;
  undefined4 extraout_var_00;
  Symbol *this_01;
  ValueSymbol *this_02;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  Diagnostic *pDVar7;
  char *func;
  socklen_t extraout_EDX;
  socklen_t extraout_EDX_00;
  socklen_t __len;
  DiagCode code;
  SyntaxNode *this_03;
  undefined7 in_register_00000081;
  SourceRange SVar8;
  ASTContext ctx;
  Expression *local_a0;
  SyntaxNode *local_98;
  long local_90;
  ASTContext local_88;
  variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>
  *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 extraout_var;
  
  decomposePropExpr((ast *)&local_98,propExpr);
  local_88.assertionInstance = context->assertionInstance;
  local_88.scope.ptr = (context->scope).ptr;
  local_88.lookupIndex = context->lookupIndex;
  local_88._12_4_ = *(undefined4 *)&context->field_0xc;
  local_88.flags.m_bits = (context->flags).m_bits;
  local_88.instanceOrProc = context->instanceOrProc;
  local_88.firstTempVar = context->firstTempVar;
  local_88.randomizeDetails = context->randomizeDetails;
  if (((int)CONCAT71(in_register_00000081,isRecursiveProp) != 0) &&
     ((formal->localVarDirection).super__Optional_base<slang::ast::ArgumentDirection,_true,_true>.
      _M_payload.super__Optional_payload_base<slang::ast::ArgumentDirection>._M_engaged == false)) {
    this_03 = local_98;
    if (local_98 != (SyntaxNode *)0x0) {
      do {
        if (this_03->kind != ParenthesizedExpression) {
          if (this_03->kind != IdentifierName) goto LAB_003a2a86;
          goto LAB_003a2a8b;
        }
        pPVar5 = slang::syntax::SyntaxNode::as<slang::syntax::ParenthesizedExpressionSyntax>
                           (this_03);
        this_03 = &((pPVar5->expression).ptr)->super_SyntaxNode;
      } while (this_03 != (SyntaxNode *)0x0);
      func = 
      "T slang::not_null<slang::syntax::ExpressionSyntax *>::get() const [T = slang::syntax::ExpressionSyntax *]"
      ;
      goto LAB_003a2a75;
    }
LAB_003a2a86:
    local_88.flags.m_bits = local_88.flags.m_bits | 0x2000000;
  }
LAB_003a2a8b:
  this_00 = DeclaredType::getType(&formal->declaredType);
  __len = extraout_EDX;
  if (this_00->canonical == (Type *)0x0) {
    Type::resolveCanonical(this_00);
    __len = extraout_EDX_00;
  }
  switch((this_00->canonical->super_Symbol).kind) {
  case EventType:
    iVar4 = TimingControl::bind((int)propExpr,(sockaddr *)&local_88,__len);
    pEVar6 = (Expression *)CONCAT44(extraout_var,iVar4);
    local_a0 = pEVar6;
    std::
    variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>
    ::operator=((variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>
                 *)result,(TimingControl **)&local_a0);
    goto LAB_003a2ca6;
  default:
    if (local_98 == (SyntaxNode *)0x0) {
      SVar8 = slang::syntax::SyntaxNode::sourceRange(&propExpr->super_SyntaxNode);
      pDVar7 = ASTContext::addDiag(&local_88,(DiagCode)0x20007,SVar8);
LAB_003a2cfd:
      operator<<(pDVar7,this_00);
      return false;
    }
    local_50 = (variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>
                *)result;
    iVar4 = Expression::bind((int)local_98,(sockaddr *)&local_88,0);
    pEVar6 = (Expression *)CONCAT44(extraout_var_00,iVar4);
    bVar3 = Expression::bad(pEVar6);
    if (bVar3) {
      return false;
    }
    pTVar1 = (pEVar6->type).ptr;
    if (pTVar1 != (Type *)0x0) {
      bVar3 = Type::isCastCompatible(this_00,pTVar1);
      this = local_50;
      if (bVar3) {
        if (((formal->localVarDirection).
             super__Optional_base<slang::ast::ArgumentDirection,_true,_true>._M_payload.
             super__Optional_payload_base<slang::ast::ArgumentDirection>._M_engaged != true) ||
           (1 < (formal->localVarDirection).
                super__Optional_base<slang::ast::ArgumentDirection,_true,_true>._M_payload.
                super__Optional_payload_base<slang::ast::ArgumentDirection>._M_payload._M_value -
                Out)) {
LAB_003a2bb6:
          local_a0 = pEVar6;
          std::
          variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>
          ::operator=(this,&local_a0);
          return true;
        }
        this_01 = Expression::getSymbolReference(pEVar6,true);
        if ((this_01 != (Symbol *)0x0) && (this_01->kind == LocalAssertionVar)) {
          this_02 = Symbol::as<slang::ast::ValueSymbol>(this_01);
          pSVar2 = (context->scope).ptr;
          if (pSVar2 != (Scope *)0x0) {
            local_48 = 0;
            uStack_40 = 0;
            ValueSymbol::addDriver
                      (this_02,Procedural,pEVar6,pSVar2->thisSym,
                       (bitmask<slang::ast::AssignFlags>)0x80,(SourceRange)ZEXT816(0),
                       (EvalContext *)0x0);
            goto LAB_003a2bb6;
          }
          func = 
          "T slang::not_null<const slang::ast::Scope *>::get() const [T = const slang::ast::Scope *]"
          ;
          goto LAB_003a2a75;
        }
        SVar8 = pEVar6->sourceRange;
        code.subsystem = Expressions;
        code.code = 7;
        goto LAB_003a2cc8;
      }
      SVar8 = slang::syntax::SyntaxNode::sourceRange(&propExpr->super_SyntaxNode);
      pDVar7 = ASTContext::addDiag(&local_88,(DiagCode)0x30007,SVar8);
      pTVar1 = (pEVar6->type).ptr;
      if (pTVar1 != (Type *)0x0) {
        pDVar7 = operator<<(pDVar7,pTVar1);
        goto LAB_003a2cfd;
      }
    }
    func = "T slang::not_null<const slang::ast::Type *>::get() const [T = const slang::ast::Type *]"
    ;
LAB_003a2a75:
    assert::assertFailed
              ("ptr",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
               ,0x26,func);
  case UntypedType:
    if (local_98 != (SyntaxNode *)0x0) {
      iVar4 = Expression::bind((int)local_98,(sockaddr *)&local_88,0x800);
      local_a0 = (Expression *)CONCAT44(extraout_var_01,iVar4);
      std::
      variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>
      ::operator=((variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>
                   *)result,&local_a0);
      bVar3 = Expression::bad((Expression *)CONCAT44(extraout_var_01,iVar4));
      return !bVar3;
    }
    local_88.flags.m_bits = local_88.flags.m_bits | 0x100000;
    break;
  case SequenceType:
    if (local_90 != 0) {
      iVar4 = AssertionExpr::bind((int)local_90,(sockaddr *)&local_88,0);
      local_a0 = (Expression *)CONCAT44(extraout_var_02,iVar4);
      bVar3 = local_a0->kind != Invalid;
      if (bVar3) {
        AssertionExpr::requireSequence((AssertionExpr *)local_a0,&local_88);
        std::
        variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>
        ::operator=((variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>
                     *)result,(AssertionExpr **)&local_a0);
        return bVar3;
      }
      return bVar3;
    }
    SVar8 = slang::syntax::SyntaxNode::sourceRange(&propExpr->super_SyntaxNode);
    code.subsystem = Expressions;
    code.code = 4;
LAB_003a2cc8:
    ASTContext::addDiag(&local_88,code,SVar8);
LAB_003a2d0a:
    return false;
  case PropertyType:
    break;
  case ErrorType:
    goto LAB_003a2d0a;
  }
  iVar4 = AssertionExpr::bind((AssertionExpr *)propExpr,(int)&local_88,(sockaddr *)0x0,0);
  pEVar6 = (Expression *)CONCAT44(extraout_var_03,iVar4);
  local_a0 = pEVar6;
  std::
  variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>
  ::operator=((variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>
               *)result,(AssertionExpr **)&local_a0);
LAB_003a2ca6:
  return pEVar6->kind != Invalid;
}

Assistant:

static bool checkAssertionArg(const PropertyExprSyntax& propExpr, const AssertionPortSymbol& formal,
                              const ASTContext& context,
                              AssertionInstanceExpression::ActualArg& result,
                              bool isRecursiveProp) {
    auto [seqExpr, regExpr] = decomposePropExpr(propExpr);

    ASTContext ctx = context;
    if (isRecursiveProp && !formal.isLocalVar()) {
        // For every recursive instance of property q in the declaration of property p,
        // each actual argument expression e of the instance must satisfy at least one
        // of the following conditions:
        // 1. e is itself a formal argument of p.
        // 2. No formal argument of p appears in e.
        // 3. e is bound to a local variable formal argument of q.
        if (!regExpr)
            ctx.flags |= ASTFlags::RecursivePropertyArg;
        else {
            auto expr = regExpr;
            while (expr->kind == SyntaxKind::ParenthesizedExpression)
                expr = expr->as<ParenthesizedExpressionSyntax>().expression;

            // This check filters out cases where the entire argument is a formal argument.
            if (expr->kind != SyntaxKind::IdentifierName)
                ctx.flags |= ASTFlags::RecursivePropertyArg;
        }
    }

    auto& type = formal.declaredType.getType();
    switch (type.getCanonicalType().kind) {
        case SymbolKind::UntypedType:
            // Untyped formals allow everything. Bind here just so we notice things like
            // name resolution errors even if the argument ends up being unused in the
            // body of the sequence / property.
            if (regExpr) {
                auto& bound = Expression::bind(*regExpr, ctx, ASTFlags::AllowUnboundedLiteral);
                result = &bound;
                return !bound.bad();
            }
            else {
                ctx.flags |= ASTFlags::AssertionInstanceArgCheck;
                auto& bound = AssertionExpr::bind(propExpr, ctx);
                result = &bound;
                return !bound.bad();
            }
        case SymbolKind::SequenceType: {
            if (!seqExpr) {
                ctx.addDiag(diag::AssertionArgTypeSequence, propExpr.sourceRange());
                return false;
            }

            auto& bound = AssertionExpr::bind(*seqExpr, ctx);
            if (bound.bad())
                return false;

            bound.requireSequence(ctx);
            result = &bound;
            return true;
        }
        case SymbolKind::PropertyType: {
            auto& bound = AssertionExpr::bind(propExpr, ctx);
            result = &bound;
            return !bound.bad();
        }
        case SymbolKind::EventType: {
            auto& bound = TimingControl::bind(propExpr, ctx);
            result = &bound;
            return !bound.bad();
        }
        case SymbolKind::ErrorType:
            return false;
        default:
            break;
    }

    // For all other types, we need a normal expression that
    // is cast compatible with the target type.
    if (!regExpr) {
        ctx.addDiag(diag::AssertionArgNeedsRegExpr, propExpr.sourceRange()) << type;
        return false;
    }

    auto& bound = Expression::bind(*regExpr, ctx);
    if (bound.bad())
        return false;

    if (!type.isCastCompatible(*bound.type)) {
        ctx.addDiag(diag::AssertionArgTypeMismatch, propExpr.sourceRange()) << *bound.type << type;
        return false;
    }

    // Local var formals that are output or inout must bind only to another local var.
    if (formal.localVarDirection == ArgumentDirection::InOut ||
        formal.localVarDirection == ArgumentDirection::Out) {
        auto sym = bound.getSymbolReference();
        if (!sym || sym->kind != SymbolKind::LocalAssertionVar) {
            ctx.addDiag(diag::AssertionOutputLocalVar, bound.sourceRange);
            return false;
        }

        sym->as<ValueSymbol>().addDriver(DriverKind::Procedural, bound, context.scope->asSymbol(),
                                         AssignFlags::AssertionLocalVarFormalArg);
    }

    result = &bound;
    return true;
}